

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_1_4_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  float *pfVar24;
  int iVar25;
  float *data;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  float *pfVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  float *pfVar44;
  int k_count;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [12];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  int l0_1;
  int data_width;
  int l_count0_1;
  int l0;
  int l_count0;
  
  auVar52._8_4_ = 0x80000000;
  auVar52._0_8_ = 0x8000000080000000;
  auVar52._12_4_ = 0x80000000;
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  fVar59 = ipoint->scale;
  auVar81 = ZEXT464((uint)fVar59);
  auVar45 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)fVar59),auVar52,0xf8);
  auVar45 = ZEXT416((uint)(fVar59 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  iVar41 = (int)auVar45._0_4_;
  fVar58 = -0.08 / (fVar59 * fVar59);
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->x),auVar52,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->x + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47._0_8_ = (double)auVar46._0_4_;
  auVar47._8_8_ = auVar46._8_8_;
  auVar51._0_8_ = (double)fVar59;
  auVar51._8_8_ = 0;
  auVar46 = vfmadd231sd_fma(auVar47,auVar51,ZEXT816(0x3fe0000000000000));
  auVar50._0_4_ = (float)auVar46._0_8_;
  auVar50._4_12_ = auVar46._4_12_;
  auVar46 = vpternlogd_avx512vl(auVar53,ZEXT416((uint)ipoint->y),auVar52,0xf8);
  auVar46 = ZEXT416((uint)(ipoint->y + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar48._0_8_ = (double)auVar46._0_4_;
  auVar48._8_8_ = auVar46._8_8_;
  auVar46 = vfmadd231sd_fma(auVar48,auVar51,ZEXT816(0x3fe0000000000000));
  auVar49._0_4_ = (float)auVar46._0_8_;
  auVar49._4_12_ = auVar46._4_12_;
  auVar46._0_4_ = (int)auVar45._0_4_;
  auVar46._4_4_ = (int)auVar45._4_4_;
  auVar46._8_4_ = (int)auVar45._8_4_;
  auVar46._12_4_ = (int)auVar45._12_4_;
  auVar45 = vcvtdq2ps_avx(auVar46);
  fVar3 = auVar50._0_4_ - auVar45._0_4_;
  fVar4 = auVar49._0_4_ - auVar45._0_4_;
  auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar59),auVar50);
  auVar46 = vpternlogd_avx512vl(auVar53,auVar45,auVar52,0xf8);
  auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = ZEXT416((uint)fVar59);
  if (iVar41 < (int)auVar45._0_4_) {
    auVar45 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar46,auVar49);
    auVar54._8_4_ = 0x3effffff;
    auVar54._0_8_ = 0x3effffff3effffff;
    auVar54._12_4_ = 0x3effffff;
    auVar55._8_4_ = 0x80000000;
    auVar55._0_8_ = 0x8000000080000000;
    auVar55._12_4_ = 0x80000000;
    auVar47 = vpternlogd_avx512vl(auVar55,auVar45,auVar54,0xea);
    auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
    auVar45 = vroundss_avx(auVar45,auVar45,0xb);
    if (iVar41 < (int)auVar45._0_4_) {
      auVar45 = vfmadd231ss_fma(auVar50,auVar46,ZEXT416(0x41300000));
      auVar56._8_4_ = 0x80000000;
      auVar56._0_8_ = 0x8000000080000000;
      auVar56._12_4_ = 0x80000000;
      auVar47 = vpternlogd_avx512vl(auVar56,auVar45,auVar54,0xea);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
      auVar45 = vroundss_avx(auVar45,auVar45,0xb);
      if ((int)auVar45._0_4_ + iVar41 <= iimage->width) {
        auVar45 = vfmadd231ss_fma(auVar49,auVar46,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar47 = vpternlogd_avx512vl(auVar54,auVar45,auVar13,0xf8);
        auVar45 = ZEXT416((uint)(auVar45._0_4_ + auVar47._0_4_));
        auVar45 = vroundss_avx(auVar45,auVar45,0xb);
        if ((int)auVar45._0_4_ + iVar41 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar36 = iimage->data;
          iVar1 = iimage->data_width;
          iVar15 = iVar41 * 2;
          pfVar24 = haarResponseY + 3;
          pfVar44 = haarResponseX + 3;
          iVar32 = -0xc;
          lVar21 = 0;
          do {
            auVar45._0_4_ = (float)iVar32;
            auVar45._4_12_ = in_ZMM9._4_12_;
            auVar45 = vfmadd213ss_fma(auVar45,auVar46,ZEXT416((uint)(fVar4 + 0.5)));
            iVar16 = (int)auVar45._0_4_;
            iVar17 = (iVar16 + -1) * iVar1;
            iVar18 = (iVar16 + -1 + iVar41) * iVar1;
            iVar16 = (iVar16 + -1 + iVar15) * iVar1;
            lVar29 = 0;
            do {
              iVar25 = (int)lVar29;
              auVar70._0_4_ = (float)(iVar25 + -0xc);
              auVar70._4_12_ = in_ZMM10._4_12_;
              auVar45 = vfmadd213ss_fma(auVar70,auVar46,ZEXT416((uint)fVar3));
              iVar31 = (int)auVar45._0_4_;
              auVar76._0_4_ = (float)(iVar25 + -0xb);
              auVar78 = in_ZMM9._4_12_;
              auVar76._4_12_ = auVar78;
              auVar73._0_4_ = (float)(iVar25 + -10);
              auVar73._4_12_ = auVar78;
              auVar45 = vfmadd213ss_fma(auVar76,auVar46,ZEXT416((uint)fVar3));
              auVar71._0_4_ = (float)(iVar25 + -9);
              auVar71._4_12_ = auVar78;
              iVar42 = iVar31 + -1 + iVar41;
              iVar39 = iVar31 + -1 + iVar15;
              fVar59 = pfVar36[iVar18 + -1 + iVar31];
              fVar63 = pfVar36[iVar16 + -1 + iVar31];
              in_ZMM9 = ZEXT464((uint)pfVar36[iVar39 + iVar16]);
              iVar19 = (int)auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(auVar73,auVar46,ZEXT416((uint)fVar3));
              fVar67 = pfVar36[iVar17 + iVar39];
              auVar48 = SUB6416(ZEXT464(0x40000000),0);
              auVar49 = ZEXT416((uint)(pfVar36[iVar39 + iVar16] - pfVar36[iVar17 + -1 + iVar31]));
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar17 + iVar42] -
                                                      pfVar36[iVar42 + iVar16])),auVar48,auVar49);
              fVar74 = pfVar36[iVar18 + iVar39];
              pfVar44[lVar29 + -3] = (fVar63 - fVar67) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar74)),auVar48,auVar49);
              pfVar24[lVar29 + -3] = auVar47._0_4_ - (fVar63 - fVar67);
              iVar42 = iVar19 + -1 + iVar41;
              iVar39 = iVar19 + -1 + iVar15;
              fVar59 = pfVar36[iVar18 + -1 + iVar19];
              fVar63 = pfVar36[iVar16 + -1 + iVar19];
              fVar67 = pfVar36[iVar39 + iVar16];
              iVar31 = (int)auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(auVar71,auVar46,ZEXT416((uint)fVar3));
              fVar74 = pfVar36[iVar17 + -1 + iVar19];
              fVar5 = pfVar36[iVar17 + iVar39];
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar17 + iVar42] -
                                                      pfVar36[iVar42 + iVar16])),auVar48,
                                        ZEXT416((uint)(fVar67 - fVar74)));
              fVar64 = pfVar36[iVar18 + iVar39];
              pfVar44[lVar29 + -2] = (fVar63 - fVar5) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar64)),auVar48,
                                        ZEXT416((uint)(fVar67 - fVar74)));
              pfVar24[lVar29 + -2] = auVar47._0_4_ - (fVar63 - fVar5);
              iVar42 = iVar31 + -1 + iVar41;
              iVar39 = iVar31 + -1 + iVar15;
              fVar59 = pfVar36[iVar18 + -1 + iVar31];
              fVar63 = pfVar36[iVar16 + -1 + iVar31];
              fVar67 = pfVar36[iVar39 + iVar16];
              iVar19 = (int)auVar45._0_4_;
              fVar74 = pfVar36[iVar17 + -1 + iVar31];
              fVar5 = pfVar36[iVar17 + iVar39];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar17 + iVar42] -
                                                      pfVar36[iVar42 + iVar16])),auVar48,
                                        ZEXT416((uint)(fVar67 - fVar74)));
              fVar64 = pfVar36[iVar18 + iVar39];
              pfVar44[lVar29 + -1] = (fVar63 - fVar5) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar64)),auVar48,
                                        ZEXT416((uint)(fVar67 - fVar74)));
              iVar42 = iVar19 + -1 + iVar41;
              iVar39 = iVar19 + -1 + iVar15;
              pfVar24[lVar29 + -1] = auVar45._0_4_ - (fVar63 - fVar5);
              fVar59 = pfVar36[iVar18 + -1 + iVar19];
              fVar63 = pfVar36[iVar16 + -1 + iVar19];
              fVar67 = pfVar36[iVar39 + iVar16];
              fVar74 = pfVar36[iVar17 + -1 + iVar19];
              fVar5 = pfVar36[iVar17 + iVar39];
              fVar64 = pfVar36[iVar18 + iVar39];
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar17 + iVar42] -
                                                      pfVar36[iVar42 + iVar16])),auVar48,
                                        ZEXT416((uint)(fVar67 - fVar74)));
              pfVar44[lVar29] = (fVar63 - fVar5) + auVar45._0_4_;
              auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar64)),auVar48,
                                        ZEXT416((uint)(fVar67 - fVar74)));
              pfVar24[lVar29] = auVar45._0_4_ - (fVar63 - fVar5);
              lVar29 = lVar29 + 4;
            } while (iVar25 + -0xc < 8);
            iVar32 = iVar32 + 1;
            lVar21 = lVar21 + 1;
            pfVar24 = pfVar24 + 0x18;
            pfVar44 = pfVar44 + 0x18;
          } while (lVar21 != 0x18);
          goto LAB_001a3911;
        }
      }
    }
  }
  iVar1 = iVar41 * 2;
  iVar15 = -0xc;
  lVar29 = 0;
  lVar21 = 0;
  do {
    auVar60._0_4_ = (float)iVar15;
    auVar60._4_12_ = in_ZMM8._4_12_;
    auVar45 = vfmadd213ss_fma(auVar60,auVar81._0_16_,ZEXT416((uint)fVar4));
    fVar59 = auVar45._0_4_;
    iVar39 = (int)((double)((ulong)(0.0 <= fVar59) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar59) * -0x4020000000000000) + (double)fVar59);
    iVar16 = iVar1 + iVar39;
    iVar17 = iVar39 + -1;
    iVar18 = iVar39 + -1 + iVar41;
    lVar28 = lVar29;
    iVar32 = -0xc;
    do {
      auVar61._0_4_ = (float)iVar32;
      auVar78 = in_ZMM8._4_12_;
      auVar61._4_12_ = auVar78;
      auVar48 = auVar81._0_16_;
      auVar45 = vfmadd213ss_fma(auVar61,auVar48,ZEXT416((uint)fVar3));
      auVar75._0_4_ = (float)(iVar32 + 1);
      auVar75._4_12_ = auVar78;
      auVar47 = vfmadd213ss_fma(auVar75,auVar48,ZEXT416((uint)fVar3));
      fVar74 = auVar47._0_4_;
      auVar68._0_4_ = (float)(iVar32 + 2);
      auVar68._4_12_ = auVar78;
      auVar47 = vfmadd213ss_fma(auVar68,auVar48,ZEXT416((uint)fVar3));
      auVar65._0_4_ = (float)(iVar32 + 3);
      auVar65._4_12_ = auVar78;
      auVar48 = vfmadd213ss_fma(auVar65,auVar48,ZEXT416((uint)fVar3));
      fVar59 = auVar45._0_4_;
      fVar67 = auVar47._0_4_;
      fVar63 = auVar48._0_4_;
      pfVar36 = (float *)((long)haarResponseY + lVar28);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar59) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar59) * -0x4020000000000000) + (double)fVar59);
      if ((((iVar39 < 1) || (iVar25 < 1)) || (iimage->height < iVar16)) ||
         (iVar19 = iVar1 + iVar25, iimage->width < iVar19)) {
        haarXY(iimage,iVar39,iVar25,iVar41,(float *)((long)haarResponseX + lVar28),pfVar36);
      }
      else {
        iVar31 = iVar25 + -1 + iVar41;
        pfVar44 = iimage->data;
        iVar42 = iimage->data_width;
        iVar38 = iVar42 * iVar17;
        fVar59 = pfVar44[iVar42 * iVar18 + -1 + iVar25];
        iVar33 = iVar42 * (iVar1 + -1 + iVar39);
        fVar5 = pfVar44[iVar33 + -1 + iVar25];
        fVar64 = pfVar44[iVar33 + -1 + iVar19];
        fVar6 = pfVar44[iVar38 + -1 + iVar25];
        fVar7 = pfVar44[iVar38 + -1 + iVar19];
        fVar8 = pfVar44[iVar42 * iVar18 + -1 + iVar19];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar44[iVar38 + iVar31] - pfVar44[iVar33 + iVar31]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar64 - fVar6)));
        *(float *)((long)haarResponseX + lVar28) = (fVar5 - fVar7) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar64 - fVar6)));
        *pfVar36 = auVar45._0_4_ - (fVar5 - fVar7);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar74) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar74) * -0x4020000000000000) + (double)fVar74);
      pfVar36 = (float *)((long)haarResponseX + lVar28 + 4);
      pfVar44 = (float *)((long)haarResponseY + lVar28 + 4);
      if (((iVar39 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar16 || (iVar19 = iVar1 + iVar25, iimage->width < iVar19)))) {
        haarXY(iimage,iVar39,iVar25,iVar41,pfVar36,pfVar44);
      }
      else {
        iVar38 = iVar25 + -1 + iVar41;
        pfVar24 = iimage->data;
        iVar42 = iimage->data_width;
        iVar33 = iVar42 * iVar17;
        fVar59 = pfVar24[iVar42 * iVar18 + -1 + iVar25];
        iVar31 = iVar42 * (iVar1 + -1 + iVar39);
        fVar74 = pfVar24[iVar31 + -1 + iVar25];
        fVar5 = pfVar24[iVar31 + -1 + iVar19];
        fVar64 = pfVar24[iVar33 + -1 + iVar25];
        fVar6 = pfVar24[iVar33 + -1 + iVar19];
        fVar7 = pfVar24[iVar42 * iVar18 + -1 + iVar19];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar24[iVar33 + iVar38] - pfVar24[iVar31 + iVar38]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar64)));
        *pfVar36 = (fVar74 - fVar6) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar64)));
        *pfVar44 = auVar45._0_4_ - (fVar74 - fVar6);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
      pfVar36 = (float *)((long)haarResponseX + lVar28 + 8);
      pfVar44 = (float *)((long)haarResponseY + lVar28 + 8);
      if (((iVar39 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar16 || (iVar19 = iVar1 + iVar25, iimage->width < iVar19)))) {
        haarXY(iimage,iVar39,iVar25,iVar41,pfVar36,pfVar44);
      }
      else {
        iVar31 = iVar25 + -1 + iVar41;
        pfVar24 = iimage->data;
        iVar42 = iimage->data_width;
        iVar38 = iVar42 * iVar17;
        fVar59 = pfVar24[iVar42 * iVar18 + -1 + iVar25];
        iVar33 = iVar42 * (iVar1 + -1 + iVar39);
        fVar67 = pfVar24[iVar33 + -1 + iVar25];
        fVar74 = pfVar24[iVar33 + -1 + iVar19];
        fVar5 = pfVar24[iVar38 + -1 + iVar25];
        fVar64 = pfVar24[iVar38 + -1 + iVar19];
        fVar6 = pfVar24[iVar42 * iVar18 + -1 + iVar19];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar24[iVar38 + iVar31] - pfVar24[iVar33 + iVar31]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar74 - fVar5)));
        *pfVar36 = (fVar67 - fVar64) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar74 - fVar5)));
        *pfVar44 = auVar45._0_4_ - (fVar67 - fVar64);
      }
      iVar25 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
      pfVar36 = (float *)((long)haarResponseX + lVar28 + 0xc);
      pfVar44 = (float *)((long)haarResponseY + lVar28 + 0xc);
      if ((((iVar39 < 1) || (iVar25 < 1)) || (iimage->height < iVar16)) ||
         (iVar19 = iVar1 + iVar25, iimage->width < iVar19)) {
        haarXY(iimage,iVar39,iVar25,iVar41,pfVar36,pfVar44);
      }
      else {
        iVar31 = iVar25 + -1 + iVar41;
        pfVar24 = iimage->data;
        iVar42 = iimage->data_width;
        iVar38 = iVar42 * iVar17;
        fVar59 = pfVar24[iVar42 * iVar18 + -1 + iVar25];
        iVar33 = iVar42 * (iVar1 + -1 + iVar39);
        fVar63 = pfVar24[iVar33 + -1 + iVar25];
        fVar67 = pfVar24[iVar33 + -1 + iVar19];
        fVar74 = pfVar24[iVar38 + -1 + iVar25];
        fVar5 = pfVar24[iVar38 + -1 + iVar19];
        fVar64 = pfVar24[iVar42 * iVar18 + -1 + iVar19];
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(pfVar24[iVar38 + iVar31] - pfVar24[iVar33 + iVar31]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar74)));
        *pfVar36 = (fVar63 - fVar5) + auVar45._0_4_;
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar64)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar74)));
        *pfVar44 = auVar45._0_4_ - (fVar63 - fVar5);
      }
      auVar81 = ZEXT1664(auVar46);
      lVar28 = lVar28 + 0x10;
      bVar2 = iVar32 < 8;
      iVar32 = iVar32 + 4;
    } while (bVar2);
    iVar15 = iVar15 + 1;
    lVar21 = lVar21 + 1;
    lVar29 = lVar29 + 0x60;
  } while (lVar21 != 0x18);
LAB_001a3911:
  fVar59 = auVar81._0_4_;
  auVar80._8_4_ = 0x3effffff;
  auVar80._0_8_ = 0x3effffff3effffff;
  auVar80._12_4_ = 0x3effffff;
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar45 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 0.5)),auVar79,0xf8);
  auVar45 = ZEXT416((uint)(fVar59 * 0.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 1.5)),auVar79,0xf8);
  auVar46 = ZEXT416((uint)(fVar59 * 1.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 2.5)),auVar79,0xf8);
  auVar47 = ZEXT416((uint)(fVar59 * 2.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 3.5)),auVar79,0xf8);
  auVar48 = ZEXT416((uint)(fVar59 * 3.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 4.5)),auVar79,0xf8);
  auVar49 = ZEXT416((uint)(fVar59 * 4.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 5.5)),auVar79,0xf8);
  auVar50 = ZEXT416((uint)(fVar59 * 5.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 6.5)),auVar79,0xf8);
  auVar51 = ZEXT416((uint)(fVar59 * 6.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 7.5)),auVar79,0xf8);
  auVar52 = ZEXT416((uint)(auVar52._0_4_ + fVar59 * 7.5));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 8.5)),auVar79,0xf8);
  auVar53 = ZEXT416((uint)(fVar59 * 8.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 9.5)),auVar79,0xf8);
  auVar54 = ZEXT416((uint)(fVar59 * 9.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 10.5)),auVar79,0xf8);
  auVar55 = ZEXT416((uint)(fVar59 * 10.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar59 * 11.5)),auVar79,0xf8);
  auVar56 = ZEXT416((uint)(fVar59 * 11.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  fVar64 = auVar47._0_4_;
  fVar59 = fVar64 + auVar46._0_4_;
  fVar3 = fVar64 + auVar45._0_4_;
  fVar4 = fVar64 - auVar45._0_4_;
  fVar63 = fVar64 - auVar46._0_4_;
  fVar67 = fVar64 - auVar48._0_4_;
  fVar74 = fVar64 - auVar49._0_4_;
  fVar5 = fVar64 - auVar50._0_4_;
  fVar64 = fVar64 - auVar51._0_4_;
  fVar77 = auVar52._0_4_;
  fVar6 = fVar77 - auVar48._0_4_;
  fVar7 = fVar77 - auVar49._0_4_;
  fVar8 = fVar77 - auVar50._0_4_;
  fVar9 = fVar77 - auVar51._0_4_;
  fVar10 = fVar77 - auVar53._0_4_;
  fVar11 = fVar77 - auVar54._0_4_;
  fVar12 = fVar77 - auVar55._0_4_;
  fVar77 = fVar77 - auVar56._0_4_;
  gauss_s1_c0[0] = expf(fVar59 * fVar59 * fVar58);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar58);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar58);
  gauss_s1_c0[3] = expf(fVar63 * fVar63 * fVar58);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar67 * fVar67 * fVar58);
  gauss_s1_c0[6] = expf(fVar74 * fVar74 * fVar58);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar58);
  gauss_s1_c0[8] = expf(fVar64 * fVar64 * fVar58);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar58);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar58);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar58);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar58);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar58);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar58);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar58);
  gauss_s1_c1[8] = expf(fVar77 * fVar77 * fVar58);
  uVar22 = 0xfffffff8;
  lVar21 = 0;
  fVar59 = 0.0;
  auVar62._8_4_ = 0x7fffffff;
  auVar62._0_8_ = 0x7fffffff7fffffff;
  auVar62._12_4_ = 0x7fffffff;
  lVar29 = 0;
  lVar28 = 0;
  do {
    pfVar36 = gauss_s1_c1;
    uVar20 = (uint)uVar22;
    if (uVar20 != 7) {
      pfVar36 = gauss_s1_c0;
    }
    if (uVar20 == 0xfffffff8) {
      pfVar36 = gauss_s1_c1;
    }
    lVar29 = (long)(int)lVar29;
    iVar41 = (int)lVar28;
    lVar28 = (long)iVar41;
    lVar35 = (long)haarResponseX + lVar21;
    lVar27 = (long)haarResponseY + lVar21;
    uVar34 = 0xfffffff8;
    uVar30 = 0;
    do {
      pfVar44 = gauss_s1_c1;
      if (uVar34 != 7) {
        pfVar44 = gauss_s1_c0;
      }
      if (uVar34 == 0xfffffff8) {
        pfVar44 = gauss_s1_c1;
      }
      uVar23 = (ulong)(uVar34 >> 0x1c & 0xfffffff8);
      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar26 = uVar30;
      lVar40 = lVar35;
      lVar43 = lVar27;
      do {
        lVar37 = 0;
        pfVar24 = (float *)((long)pfVar36 + (ulong)(uint)((int)(uVar22 >> 0x1f) << 5));
        do {
          fVar3 = pfVar44[uVar23] * *pfVar24;
          auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar43 + lVar37 * 4)),
                                  ZEXT416(*(uint *)(lVar40 + lVar37 * 4)),0x10);
          auVar72._0_4_ = fVar3 * auVar45._0_4_;
          auVar72._4_4_ = fVar3 * auVar45._4_4_;
          auVar72._8_4_ = fVar3 * auVar45._8_4_;
          auVar72._12_4_ = fVar3 * auVar45._12_4_;
          auVar45 = vandps_avx(auVar72,auVar62);
          auVar45 = vmovlhps_avx(auVar72,auVar45);
          auVar66._0_4_ = auVar81._0_4_ + auVar45._0_4_;
          auVar66._4_4_ = auVar81._4_4_ + auVar45._4_4_;
          auVar66._8_4_ = auVar81._8_4_ + auVar45._8_4_;
          auVar66._12_4_ = auVar81._12_4_ + auVar45._12_4_;
          auVar81 = ZEXT1664(auVar66);
          pfVar24 = pfVar24 + (ulong)(~uVar20 >> 0x1f) * 2 + -1;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 9);
        uVar26 = uVar26 + 0x18;
        uVar23 = uVar23 + (ulong)(-1 < (int)uVar34) * 2 + -1;
        lVar40 = lVar40 + 0x60;
        lVar43 = lVar43 + 0x60;
      } while (uVar26 < uVar34 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar28];
      auVar14._4_4_ = fVar3;
      auVar14._0_4_ = fVar3;
      auVar14._8_4_ = fVar3;
      auVar14._12_4_ = fVar3;
      auVar47 = vmulps_avx512vl(auVar66,auVar14);
      lVar28 = lVar28 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar29) = auVar47;
      auVar69._0_4_ = auVar47._0_4_ * auVar47._0_4_;
      auVar69._4_4_ = auVar47._4_4_ * auVar47._4_4_;
      auVar69._8_4_ = auVar47._8_4_ * auVar47._8_4_;
      auVar69._12_4_ = auVar47._12_4_ * auVar47._12_4_;
      auVar45 = vmovshdup_avx(auVar69);
      auVar46 = vfmadd231ss_fma(auVar45,auVar47,auVar47);
      auVar45 = vshufpd_avx(auVar47,auVar47,1);
      auVar46 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      auVar45 = vshufps_avx(auVar47,auVar47,0xff);
      auVar45 = vfmadd213ss_fma(auVar45,auVar45,auVar46);
      fVar59 = fVar59 + auVar45._0_4_;
      lVar29 = lVar29 + 4;
      uVar34 = uVar34 + 5;
      uVar30 = uVar30 + 0x78;
      lVar35 = lVar35 + 0x1e0;
      lVar27 = lVar27 + 0x1e0;
    } while (iVar41 + 4 != (int)lVar28);
    lVar21 = lVar21 + 0x14;
    uVar22 = (ulong)(uVar20 + 5);
  } while ((int)uVar20 < 3);
  if (fVar59 < 0.0) {
    fVar59 = sqrtf(fVar59);
  }
  else {
    auVar45 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
    fVar59 = auVar45._0_4_;
  }
  auVar81 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar59)));
  lVar21 = 0;
  do {
    auVar57 = vmulps_avx512f(auVar81,*(undefined1 (*) [64])(ipoint->descriptor + lVar21));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar21) = auVar57;
    lVar21 = lVar21 + 0x10;
  } while (lVar21 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}